

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::openPersistentEditor(QAbstractItemView *this,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  bool bVar1;
  QWidget *this_01;
  long in_FS_OFFSET;
  QWidget *editor;
  QModelIndex local_118;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  memset(&local_100,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_100);
  (**(code **)(*(long *)this + 0x2f8))(this,&local_100);
  local_100.super_QStyleOption.rect = (QRect)(**(code **)(*(long *)this + 0x1e0))(this,index);
  currentIndex(&local_118,this);
  bVar1 = ::comparesEqual(index,&local_118);
  local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       ((uint)local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i | (uint)bVar1 << 8);
  this_01 = QAbstractItemViewPrivate::editor(this_00,index,&local_100);
  if (this_01 != (QWidget *)0x0) {
    QWidget::show(this_01);
    QSet<QWidget_*>::insert((QSet<QWidget_*> *)&local_118,(QWidget **)&this_00->persistent);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::openPersistentEditor(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    QStyleOptionViewItem options;
    initViewItemOption(&options);
    options.rect = visualRect(index);
    options.state |= (index == currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

    QWidget *editor = d->editor(index, options);
    if (editor) {
        editor->show();
        d->persistent.insert(editor);
    }
}